

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_art.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_1ac67::
ARTCorrectnessTest_Node256ShrinkToNode48DeleteMiddle_Test<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
::~ARTCorrectnessTest_Node256ShrinkToNode48DeleteMiddle_Test
          (ARTCorrectnessTest_Node256ShrinkToNode48DeleteMiddle_Test<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
           *this)

{
  ARTCorrectnessTest_Node256ShrinkToNode48DeleteMiddle_Test<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  *this_local;
  
  ~ARTCorrectnessTest_Node256ShrinkToNode48DeleteMiddle_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

UNODB_TYPED_TEST(ARTCorrectnessTest, Node256ShrinkToNode48DeleteMiddle) {
  unodb::test::tree_verifier<TypeParam> verifier;

  verifier.insert_key_range(1, 49);
#ifdef UNODB_DETAIL_WITH_STATS
  verifier.assert_node_counts({49, 0, 0, 0, 1});
#endif  // UNODB_DETAIL_WITH_STATS

  verifier.remove(25);
#ifdef UNODB_DETAIL_WITH_STATS
  verifier.assert_shrinking_inodes({0, 0, 0, 1});
  verifier.assert_node_counts({48, 0, 0, 1, 0});
#endif  // UNODB_DETAIL_WITH_STATS

  verifier.check_present_values();
  verifier.check_absent_keys({0, 25, 50});
}